

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  WhereInfo *db;
  bool bVar1;
  int iVar2;
  Expr *pEVar3;
  ulong uVar4;
  long lVar5;
  char *local_138;
  ulong local_130;
  int local_124;
  ulong local_120;
  int regYield;
  Expr *pX;
  Bitmask cMask_1;
  int iCol_1;
  Bitmask cMask;
  int iCol;
  Expr *pExpr;
  int regBase;
  int addrCounter;
  SrcList_item *pTabItem;
  Expr *pEStack_b8;
  int iContinue;
  Expr *pPartial;
  u8 sentWarning;
  Bitmask extraCols;
  Bitmask idxCols;
  char *zNotUsed;
  WhereLoop *pLoop;
  CollSeq *pColl;
  int local_78;
  int mxBitCol;
  int i;
  int n;
  int regRecord;
  int addrTop;
  Table *pTable;
  Vdbe *pVStack_58;
  int addrInit;
  Vdbe *v;
  Index *pIdx;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  WhereLevel *pWStack_30;
  int nKeyCol;
  WhereLevel *pLevel_local;
  Bitmask notReady_local;
  SrcList_item *pSrc_local;
  WhereClause *pWC_local;
  Parse *pParse_local;
  
  bVar1 = false;
  pEStack_b8 = (Expr *)0x0;
  pTabItem._4_4_ = 0;
  pExpr._4_4_ = 0;
  pVStack_58 = pParse->pVdbe;
  pWStack_30 = pLevel;
  pLevel_local = (WhereLevel *)notReady;
  notReady_local = (Bitmask)pSrc;
  pSrc_local = (SrcList_item *)pWC;
  pWC_local = (WhereClause *)pParse;
  pTable._4_4_ = sqlite3VdbeAddOp0(pVStack_58,0x11);
  pTerm._4_4_ = 0;
  _regRecord = *(Parse **)(notReady_local + 0x20);
  pIdx = (Index *)(&pSrc_local->pTab->zName + (long)*(int *)((long)&pSrc_local->zName + 4) * 8);
  zNotUsed = (char *)pWStack_30->pWLoop;
  extraCols = 0;
  for (pWCEnd = (WhereTerm *)pSrc_local->pTab; pWCEnd < pIdx; pWCEnd = pWCEnd + 1) {
    pEVar3 = pWCEnd->pExpr;
    if ((((*(long *)zNotUsed == 0) && ((pWCEnd->wtFlags & 2) == 0)) && ((pEVar3->flags & 1) == 0))
       && (iVar2 = sqlite3ExprIsTableConstant(pEVar3,*(int *)(notReady_local + 0x40)), iVar2 != 0))
    {
      db = pWC_local->pWInfo;
      pEVar3 = sqlite3ExprDup((sqlite3 *)pWC_local->pWInfo,pEVar3,0);
      pEStack_b8 = sqlite3ExprAnd((sqlite3 *)db,pEStack_b8,pEVar3);
    }
    iVar2 = termCanDriveIndex(pWCEnd,(SrcList_item *)notReady_local,(Bitmask)pLevel_local);
    if (iVar2 != 0) {
      iVar2 = (pWCEnd->u).leftColumn;
      if (iVar2 < 0x40) {
        local_120 = 1L << ((byte)iVar2 & 0x3f);
      }
      else {
        local_120 = 0x8000000000000000;
      }
      if (!bVar1) {
        sqlite3_log(0x11c,"automatic index on %s(%s)",_regRecord->db,
                    ((Column *)_regRecord->zErrMsg)[iVar2].zName);
        bVar1 = true;
      }
      if ((extraCols & local_120) == 0) {
        iVar2 = whereLoopResize((sqlite3 *)pWC_local->pWInfo,(WhereLoop *)zNotUsed,pTerm._4_4_ + 1);
        if (iVar2 != 0) goto LAB_001e1f64;
        *(WhereTerm **)(*(long *)(zNotUsed + 0x38) + (long)pTerm._4_4_ * 8) = pWCEnd;
        extraCols = local_120 | extraCols;
        pTerm._4_4_ = pTerm._4_4_ + 1;
      }
    }
  }
  *(short *)(zNotUsed + 0x2c) = (short)pTerm._4_4_;
  *(short *)(zNotUsed + 0x18) = (short)pTerm._4_4_;
  zNotUsed[0x28] = 'A';
  zNotUsed[0x29] = 'B';
  zNotUsed[0x2a] = '\0';
  zNotUsed[0x2b] = '\0';
  uVar4 = *(ulong *)(notReady_local + 0x58) & (extraCols ^ 0xffffffffffffffff | 0x8000000000000000);
  if (*(i16 *)((long)&_regRecord->iSelfTab + 2) < 0x40) {
    local_124 = (int)*(i16 *)((long)&_regRecord->iSelfTab + 2);
  }
  else {
    local_124 = 0x3f;
  }
  pColl._4_4_ = local_124;
  for (local_78 = 0; local_78 < local_124; local_78 = local_78 + 1) {
    if ((uVar4 & 1L << ((byte)local_78 & 0x3f)) != 0) {
      pTerm._4_4_ = pTerm._4_4_ + 1;
    }
  }
  if ((*(ulong *)(notReady_local + 0x58) & 0x8000000000000000) != 0) {
    pTerm._4_4_ = *(i16 *)((long)&_regRecord->iSelfTab + 2) + -0x3f + pTerm._4_4_;
  }
  v = (Vdbe *)sqlite3AllocateIndexObject
                        ((sqlite3 *)pWC_local->pWInfo,(short)pTerm._4_4_ + 1,0,(char **)&idxCols);
  if (v != (Vdbe *)0x0) {
    *(Vdbe **)(zNotUsed + 0x20) = v;
    v->db = (sqlite3 *)"auto-index";
    v->pParse = _regRecord;
    mxBitCol = 0;
    extraCols = 0;
    for (pWCEnd = (WhereTerm *)pSrc_local->pTab; pWCEnd < pIdx; pWCEnd = pWCEnd + 1) {
      iVar2 = termCanDriveIndex(pWCEnd,(SrcList_item *)notReady_local,(Bitmask)pLevel_local);
      if (iVar2 != 0) {
        if ((pWCEnd->u).leftColumn < 0x40) {
          local_130 = 1L << ((byte)(pWCEnd->u).leftColumn & 0x3f);
        }
        else {
          local_130 = 0x8000000000000000;
        }
        if ((extraCols & local_130) == 0) {
          pEVar3 = pWCEnd->pExpr;
          extraCols = local_130 | extraCols;
          *(short *)((long)&v->pPrev->db + (long)mxBitCol * 2) = (short)(pWCEnd->u).leftColumn;
          pLoop = (WhereLoop *)
                  sqlite3BinaryCompareCollSeq((Parse *)pWC_local,pEVar3->pLeft,pEVar3->pRight);
          if (pLoop == (WhereLoop *)0x0) {
            local_138 = "BINARY";
          }
          else {
            local_138 = (char *)pLoop->prereq;
          }
          *(char **)(*(long *)&v->iStatement + (long)mxBitCol * 8) = local_138;
          mxBitCol = mxBitCol + 1;
        }
      }
    }
    for (local_78 = 0; local_78 < pColl._4_4_; local_78 = local_78 + 1) {
      if ((uVar4 & 1L << ((byte)local_78 & 0x3f)) != 0) {
        *(short *)((long)&v->pPrev->db + (long)mxBitCol * 2) = (short)local_78;
        *(char **)(*(long *)&v->iStatement + (long)mxBitCol * 8) = "BINARY";
        mxBitCol = mxBitCol + 1;
      }
    }
    if ((*(ulong *)(notReady_local + 0x58) & 0x8000000000000000) != 0) {
      for (local_78 = 0x3f; local_78 < *(i16 *)((long)&_regRecord->iSelfTab + 2);
          local_78 = local_78 + 1) {
        *(short *)((long)&v->pPrev->db + (long)mxBitCol * 2) = (short)local_78;
        *(char **)(*(long *)&v->iStatement + (long)mxBitCol * 8) = "BINARY";
        mxBitCol = mxBitCol + 1;
      }
    }
    *(undefined2 *)((long)&v->pPrev->db + (long)mxBitCol * 2) = 0xffff;
    *(char **)(*(long *)&v->iStatement + (long)mxBitCol * 8) = "BINARY";
    iVar2 = *(int *)((long)&pWC_local->aStatic[0].pWC + 4);
    *(int *)((long)&pWC_local->aStatic[0].pWC + 4) = iVar2 + 1;
    pWStack_30->iIdxCur = iVar2;
    sqlite3VdbeAddOp2(pVStack_58,0x70,pWStack_30->iIdxCur,pTerm._4_4_ + 1);
    sqlite3VdbeSetP4KeyInfo((Parse *)pWC_local,(Index *)v);
    lVar5 = *(long *)&pSrc_local->pSchema->tblHash + 8 + (ulong)pWStack_30->iFrom * 0x70;
    if ((*(byte *)(lVar5 + 0x3d) >> 4 & 1) == 0) {
      n = sqlite3VdbeAddOp1(pVStack_58,0x24,pWStack_30->iTabCur);
    }
    else {
      iVar2 = *(int *)(lVar5 + 0x34);
      pExpr._4_4_ = sqlite3VdbeAddOp2(pVStack_58,0x46,0,0);
      sqlite3VdbeAddOp3(pVStack_58,0xd,iVar2,0,*(int *)(lVar5 + 0x30));
      n = sqlite3VdbeAddOp1(pVStack_58,0xe,iVar2);
    }
    if (pEStack_b8 != (Expr *)0x0) {
      pTabItem._4_4_ = sqlite3VdbeMakeLabel(pVStack_58);
      sqlite3ExprIfFalse((Parse *)pWC_local,pEStack_b8,pTabItem._4_4_,0x10);
      *(uint *)(zNotUsed + 0x28) = *(uint *)(zNotUsed + 0x28) | 0x20000;
    }
    i = sqlite3GetTempReg((Parse *)pWC_local);
    iVar2 = sqlite3GenerateIndexKey
                      ((Parse *)pWC_local,(Index *)v,pWStack_30->iTabCur,i,0,(int *)0x0,(Index *)0x0
                       ,0);
    sqlite3VdbeAddOp2(pVStack_58,0x85,pWStack_30->iIdxCur,i);
    sqlite3VdbeChangeP5(pVStack_58,0x10);
    if (pEStack_b8 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(pVStack_58,pTabItem._4_4_);
    }
    if ((*(byte *)(lVar5 + 0x3d) >> 4 & 1) == 0) {
      sqlite3VdbeAddOp2(pVStack_58,5,pWStack_30->iTabCur,n + 1);
    }
    else {
      sqlite3VdbeChangeP2(pVStack_58,pExpr._4_4_,iVar2 + mxBitCol);
      translateColumnToCopy((Parse *)pWC_local,n,pWStack_30->iTabCur,*(int *)(lVar5 + 0x38),1);
      sqlite3VdbeGoto(pVStack_58,n);
      *(byte *)(lVar5 + 0x3d) = *(byte *)(lVar5 + 0x3d) & 0xef;
    }
    sqlite3VdbeChangeP5(pVStack_58,3);
    sqlite3VdbeJumpHere(pVStack_58,n);
    sqlite3ReleaseTempReg((Parse *)pWC_local,i);
    sqlite3VdbeJumpHere(pVStack_58,pTable._4_4_);
  }
LAB_001e1f64:
  sqlite3ExprDelete((sqlite3 *)pWC_local->pWInfo,pEStack_b8);
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}